

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O3

result_type __thiscall
Well<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_Detail::M3<7>,_Detail::M1,_Detail::M3<12>,_Detail::M3<-10>,_Detail::M3<-19>,_Detail::M2<-11>,_Detail::M3<4>,_Detail::M3<-10>,_Detail::NoTempering>
::operator()(Well<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_Detail::M3<7>,_Detail::M1,_Detail::M3<12>,_Detail::M3<_10>,_Detail::M3<_19>,_Detail::M2<_11>,_Detail::M3<4>,_Detail::M3<_10>,_Detail::NoTempering>
             *this)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  sVar3 = this->index_;
  uVar9 = sVar3 + 0x26f;
  if (uVar9 < 0x4e0) {
    uVar5 = sVar3 - 1;
    if (uVar9 < 0x270) {
      uVar5 = uVar9;
    }
    uVar9 = sVar3 + 0x26e;
    if (uVar9 < 0x4e0) {
      uVar6 = sVar3 - 2;
      if (uVar9 < 0x270) {
        uVar6 = uVar9;
      }
      uVar9 = sVar3 + 0xcb;
      if ((uVar9 < 0x4e0) && (uVar1 = sVar3 + 0x7b, uVar1 < 0x4e0)) {
        uVar4 = this->state_[uVar5];
        uVar2 = this->state_[uVar6];
        uVar6 = sVar3 - 0x1a5;
        if (uVar9 < 0x270) {
          uVar6 = uVar9;
        }
        uVar9 = sVar3 - 0xb;
        if (sVar3 + 0x265 < 0x270) {
          uVar9 = sVar3 + 0x265;
        }
        uVar8 = this->state_[sVar3] >> 7 ^ this->state_[uVar6] ^ this->state_[sVar3];
        uVar6 = sVar3 - 0x1f5;
        if (uVar1 < 0x270) {
          uVar6 = uVar1;
        }
        uVar7 = this->state_[uVar9] ^ this->state_[uVar6] ^
                this->state_[uVar6] << 10 ^ this->state_[uVar9] >> 0xc;
        uVar10 = uVar7 ^ uVar8;
        this->state_[sVar3] = uVar10;
        uVar4 = uVar10 << 10 ^ uVar8 ^
                uVar7 >> 4 ^
                uVar8 << 0xb ^ uVar2 << 0x13 ^ (uVar2 & 0x7fffffff | uVar4 & 0x80000000);
        this->state_[uVar5] = uVar4;
        this->index_ = uVar5;
        return uVar4;
      }
    }
  }
  __assert_fail("value < 2 * r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sehe[P]well-random/well.hpp"
                ,0x9e,
                "static T Detail::Modulo<unsigned long, 624>::calc(T, std::false_type) [UIntType = unsigned long, r = 624, T = unsigned long]"
               );
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }